

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_meta___tostring(lua_State *L)

{
  ushort uVar1;
  CTState *cts;
  CType *pCVar2;
  uint64_t uVar3;
  int iVar4;
  GCcdata *pGVar5;
  GCstr *pGVar6;
  cTValue *tv;
  ulong uVar7;
  CType *pCVar8;
  CTInfo CVar9;
  ulong uVar10;
  CTypeID id;
  int in_ESI;
  GCcdata *pGVar11;
  char *fmt;
  TValue *pTVar12;
  
  pGVar5 = ffi_checkcdata(L,in_ESI);
  uVar1 = pGVar5->ctypeid;
  id = (CTypeID)uVar1;
  pGVar5 = pGVar5 + 1;
  pGVar11 = pGVar5;
  if (uVar1 == 0x16) {
    id = (CTypeID)(pGVar5->nextgc).gcptr64;
    fmt = "ctype<%s>";
    goto LAB_00120bee;
  }
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  pCVar2 = cts->tab;
  uVar7 = (ulong)(uint)uVar1;
  uVar10 = (ulong)pCVar2[uVar7].info;
  if ((pCVar2[uVar7].info & 0xf0800000) == 0x20800000) {
    uVar7 = uVar10 & 0xffff;
    uVar10 = (ulong)pCVar2[uVar7].info;
    pGVar11 = (GCcdata *)(pGVar5->nextgc).gcptr64;
  }
  pCVar8 = pCVar2 + uVar7;
  CVar9 = (CTInfo)uVar10;
  if ((CVar9 & 0xf4000000) == 0x34000000) {
    pTVar12 = L->top;
    pGVar6 = lj_ctype_repr_complex(L,pGVar5,pCVar8->size);
  }
  else {
    if ((0x3ffffff < CVar9) || (pCVar8->size != 8)) {
      iVar4 = (int)(uVar10 >> 0x1c);
      if (iVar4 == 2) {
        if (pCVar8->size == 4) {
          pGVar11 = (GCcdata *)(ulong)(uint)(pGVar11->nextgc).gcptr64;
        }
        else {
          pGVar11 = (GCcdata *)(pGVar11->nextgc).gcptr64;
        }
        CVar9 = pCVar2[uVar10 & 0xffff].info;
        pCVar8 = pCVar2 + (uVar10 & 0xffff);
LAB_00120d6a:
        fmt = "cdata<%s>: %p";
        if ((((CVar9 & 0xf0000000) == 0x10000000) || ((CVar9 & 0xf8000000) == 0x38000000)) &&
           (tv = lj_ctype_meta(cts,(int)((ulong)((long)pCVar8 - (long)pCVar2) >> 3) * -0x55555555,
                               MM_tostring), tv != (cTValue *)0x0)) {
          iVar4 = lj_meta_tailcall(L,tv);
          return iVar4;
        }
      }
      else if (iVar4 == 5) {
        pGVar11 = (GCcdata *)(pGVar11->nextgc).gcptr64;
        fmt = "cdata<%s>: %d";
      }
      else {
        if (iVar4 != 6) goto LAB_00120d6a;
        pGVar11 = (GCcdata *)(pGVar11->nextgc).gcptr64;
        fmt = "cdata<%s>: %p";
      }
LAB_00120bee:
      pGVar6 = lj_ctype_repr(L,id,(GCstr *)0x0);
      lj_strfmt_pushf(L,fmt,pGVar6 + 1,pGVar11);
      goto LAB_00120cd5;
    }
    pTVar12 = L->top;
    pGVar6 = lj_ctype_repr_int64(L,(pGVar5->nextgc).gcptr64,CVar9 & 0x800000);
  }
  pTVar12[-1].u64 = (ulong)pGVar6 | 0xfffd800000000000;
LAB_00120cd5:
  uVar3 = (L->glref).ptr64;
  if (*(ulong *)(uVar3 + 0x18) <= *(ulong *)(uVar3 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___tostring)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  const char *msg = "cdata<%s>: %p";
  CTypeID id = cd->ctypeid;
  void *p = cdataptr(cd);
  if (id == CTID_CTYPEID) {
    msg = "ctype<%s>";
    id = *(CTypeID *)p;
  } else {
    CTState *cts = ctype_cts(L);
    CType *ct = ctype_raw(cts, id);
    if (ctype_isref(ct->info)) {
      p = *(void **)p;
      ct = ctype_rawchild(cts, ct);
    }
    if (ctype_iscomplex(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_complex(L, cdataptr(cd), ct->size));
      goto checkgc;
    } else if (ct->size == 8 && ctype_isinteger(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_int64(L, *(uint64_t *)cdataptr(cd),
					       (ct->info & CTF_UNSIGNED)));
      goto checkgc;
    } else if (ctype_isfunc(ct->info)) {
      p = *(void **)p;
    } else if (ctype_isenum(ct->info)) {
      msg = "cdata<%s>: %d";
      p = (void *)(uintptr_t)*(uint32_t **)p;
    } else {
      if (ctype_isptr(ct->info)) {
	p = cdata_getptr(p, ct->size);
	ct = ctype_rawchild(cts, ct);
      }
      if (ctype_isstruct(ct->info) || ctype_isvector(ct->info)) {
	/* Handle ctype __tostring metamethod. */
	cTValue *tv = lj_ctype_meta(cts, ctype_typeid(cts, ct), MM_tostring);
	if (tv)
	  return lj_meta_tailcall(L, tv);
      }
    }
  }
  lj_strfmt_pushf(L, msg, strdata(lj_ctype_repr(L, id, NULL)), p);
checkgc:
  lj_gc_check(L);
  return 1;
}